

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O2

metric_name __thiscall fasttext::Args::getAutotuneMetric(Args *this)

{
  bool bVar1;
  metric_name mVar2;
  long lVar3;
  runtime_error *this_00;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  __lhs = &this->autotuneMetric;
  std::__cxx11::string::substr((ulong)&bStack_38,(ulong)__lhs);
  bVar1 = std::operator==(&bStack_38,"f1:");
  std::__cxx11::string::~string((string *)&bStack_38);
  if (bVar1) {
    mVar2 = f1scoreLabel;
  }
  else {
    bVar1 = std::operator==(__lhs,"f1");
    if (bVar1) {
      mVar2 = f1score;
    }
    else {
      std::__cxx11::string::substr((ulong)&bStack_38,(ulong)__lhs);
      bVar1 = std::operator==(&bStack_38,"precisionAtRecall:");
      std::__cxx11::string::~string((string *)&bStack_38);
      if (bVar1) {
        lVar3 = std::__cxx11::string::find((char *)__lhs,0x149d67);
        mVar2 = (lVar3 != -1) + precisionAtRecall;
      }
      else {
        std::__cxx11::string::substr((ulong)&bStack_38,(ulong)__lhs);
        bVar1 = std::operator==(&bStack_38,"recallAtPrecision:");
        std::__cxx11::string::~string((string *)&bStack_38);
        if (!bVar1) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&bStack_38,"Unknown metric : ",__lhs);
          std::runtime_error::runtime_error(this_00,(string *)&bStack_38);
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar3 = std::__cxx11::string::find((char *)__lhs,0x149d67);
        mVar2 = (lVar3 != -1) + recallAtPrecision;
      }
    }
  }
  return mVar2;
}

Assistant:

metric_name Args::getAutotuneMetric() const {
  if (autotuneMetric.substr(0, 3) == "f1:") {
    return metric_name::f1scoreLabel;
  } else if (autotuneMetric == "f1") {
    return metric_name::f1score;
  } else if (autotuneMetric.substr(0, 18) == "precisionAtRecall:") {
    size_t semicolon = autotuneMetric.find(":", 18);
    if (semicolon != std::string::npos) {
      return metric_name::precisionAtRecallLabel;
    }
    return metric_name::precisionAtRecall;
  } else if (autotuneMetric.substr(0, 18) == "recallAtPrecision:") {
    size_t semicolon = autotuneMetric.find(":", 18);
    if (semicolon != std::string::npos) {
      return metric_name::recallAtPrecisionLabel;
    }
    return metric_name::recallAtPrecision;
  }
  throw std::runtime_error("Unknown metric : " + autotuneMetric);
}